

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

void __thiscall duckdb::FilterCombiner::FilterCombiner(FilterCombiner *this,ClientContext *context)

{
  _Rb_tree_header *p_Var1;
  
  this->context = context;
  (this->remaining_filters).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->remaining_filters).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->remaining_filters).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stored_expressions)._M_h._M_buckets = &(this->stored_expressions)._M_h._M_single_bucket;
  (this->stored_expressions)._M_h._M_bucket_count = 1;
  (this->stored_expressions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stored_expressions)._M_h._M_element_count = 0;
  (this->stored_expressions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stored_expressions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stored_expressions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->equivalence_set_map)._M_h._M_buckets = &(this->equivalence_set_map)._M_h._M_single_bucket;
  (this->equivalence_set_map)._M_h._M_bucket_count = 1;
  (this->equivalence_set_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->equivalence_set_map)._M_h._M_element_count = 0;
  (this->equivalence_set_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->equivalence_set_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->equivalence_set_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header;
  (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->equivalence_map)._M_t._M_impl.super__Rb_tree_header;
  (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->equivalence_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->set_index = 0;
  return;
}

Assistant:

FilterCombiner::FilterCombiner(ClientContext &context) : context(context) {
}